

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

void __thiscall glcts::anon_unknown_0::TGBase::TGBase(TGBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  deqp::SubcaseBase::SubcaseBase(&this->super_SubcaseBase);
  (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_020ff638;
  iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  this->renderTarget = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  this->pixelFormat = &((RenderTarget *)CONCAT44(extraout_var,iVar1))->m_pixelFormat;
  return;
}

Assistant:

TGBase() : renderTarget(m_context.getRenderContext().getRenderTarget()), pixelFormat(renderTarget.getPixelFormat())
	{
	}